

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

la_int64_t archive_seek_data(archive *_a,int64_t offset,int whence)

{
  int iVar1;
  int magic_test;
  archive_read *a;
  int whence_local;
  int64_t offset_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,4,"archive_seek_data_block");
  if (iVar1 == -0x1e) {
    _a_local = (archive *)0xffffffffffffffe2;
  }
  else if (*(long *)(_a[0xf].error_string.length + 0x38) == 0) {
    archive_set_error(_a,0x16,"Internal error: No format_seek_data_block function registered");
    _a_local = (archive *)0xffffffffffffffe2;
  }
  else {
    _a_local = (archive *)(**(code **)(_a[0xf].error_string.length + 0x38))(_a,offset,whence);
  }
  return (la_int64_t)_a_local;
}

Assistant:

la_int64_t
archive_seek_data(struct archive *_a, int64_t offset, int whence)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_seek_data_block");

	if (a->format->seek_data == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Internal error: "
		    "No format_seek_data_block function registered");
		return (ARCHIVE_FATAL);
	}

	return (a->format->seek_data)(a, offset, whence);
}